

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O0

bool Corrade::Containers::operator>(StringView a,StringView b)

{
  int iVar1;
  ulong value;
  ulong min;
  unsigned_long __n;
  int result;
  size_t bSize;
  size_t aSize;
  StringView b_local;
  StringView a_local;
  
  value = a._sizePlusFlags & 0x3fffffffffffffff;
  min = b._sizePlusFlags & 0x3fffffffffffffff;
  __n = Utility::min<unsigned_long>(value,min);
  iVar1 = memcmp(a._data,b._data,__n);
  if (iVar1 == 0) {
    if (min < value) {
      a_local._sizePlusFlags._7_1_ = true;
    }
    else {
      a_local._sizePlusFlags._7_1_ = false;
    }
  }
  else {
    a_local._sizePlusFlags._7_1_ = 0 < iVar1;
  }
  return a_local._sizePlusFlags._7_1_;
}

Assistant:

bool operator>(const StringView a, const StringView b) {
    /* Not using the size() accessor to speed up debug builds */
    const std::size_t aSize = a._sizePlusFlags & ~Implementation::StringViewSizeMask;
    const std::size_t bSize = b._sizePlusFlags & ~Implementation::StringViewSizeMask;
    const int result = std::memcmp(a._data, b._data, Utility::min(aSize, bSize));
    if(result != 0) return result > 0;
    if(aSize > bSize) return true;
    return false;
}